

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O1

bool __thiscall Rml::ElementScroll::CreateCorner(ElementScroll *this)

{
  Element *pEVar1;
  pointer *__ptr;
  ElementPtr corner_element;
  Element *local_b8;
  _Head_base<0UL,_Rml::Element_*,_false> local_b0;
  String local_a8;
  undefined1 local_88 [40];
  undefined8 local_60;
  PropertyDefinition *local_58;
  int local_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  XMLAttributes local_38;
  
  if (this->corner == (Element *)0x0) {
    pEVar1 = this->element;
    local_88._0_8_ = local_88 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"*","");
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"scrollbarcorner","");
    local_38.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Factory::InstanceElement((Factory *)&local_b8,pEVar1,(String *)local_88,&local_a8,&local_38);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector(&local_38.m_container);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    pEVar1 = local_b8;
    this->corner = local_b8;
    local_88._0_8_ = (pointer)0x2d;
    Variant::Set((Variant *)local_88,1);
    local_60._0_4_ = NUMBER;
    local_60._4_4_ = -1;
    local_58 = (PropertyDefinition *)0x0;
    local_50 = -1;
    local_48 = (element_type *)0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Element::SetProperty(pEVar1,Clip,(Property *)local_88);
    if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
    }
    Variant::~Variant((Variant *)local_88);
    pEVar1 = this->corner;
    local_88._0_8_ = (pointer)0x2d;
    Variant::Set((Variant *)local_88,3);
    local_60._0_4_ = KEYWORD;
    local_60._4_4_ = -1;
    local_58 = (PropertyDefinition *)0x0;
    local_50 = -1;
    local_48 = (element_type *)0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Element::SetProperty(pEVar1,Drag,(Property *)local_88);
    if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
    }
    Variant::~Variant((Variant *)local_88);
    local_b0._M_head_impl = local_b8;
    local_b8 = (Element *)0x0;
    pEVar1 = Element::AppendChild(this->element,(ElementPtr *)&local_b0,false);
    if (local_b0._M_head_impl != (Element *)0x0) {
      (*((local_b0._M_head_impl)->super_ScriptInterface).super_Releasable._vptr_Releasable[2])();
    }
    local_b0._M_head_impl = (Element *)0x0;
    UpdateScrollElementProperties(this,pEVar1);
    if (local_b8 != (Element *)0x0) {
      (**(code **)(*(long *)local_b8 + 0x10))();
    }
  }
  return true;
}

Assistant:

bool ElementScroll::CreateCorner()
{
	if (corner != nullptr)
		return true;

	ElementPtr corner_element = Factory::InstanceElement(element, "*", "scrollbarcorner", XMLAttributes());
	corner = corner_element.get();
	corner->SetProperty(PropertyId::Clip, Property(1, Unit::NUMBER));
	corner->SetProperty(PropertyId::Drag, Property(Style::Drag::Block));

	Element* child = element->AppendChild(std::move(corner_element), false);
	UpdateScrollElementProperties(child);

	return true;
}